

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent
          (QGraphicsSceneContextMenuEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0x50);
  pQVar1->widget = (QWidget *)0x0;
  pQVar1->q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1->timestamp = 0;
  pQVar1->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_00813f08
  ;
  pQVar1[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[1].widget = (QWidget *)0x0;
  pQVar1[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[1].timestamp = 0;
  *(undefined8 *)((long)&pQVar1[1].timestamp + 4) = 0;
  *(undefined8 *)((long)&pQVar1[2]._vptr_QGraphicsSceneEventPrivate + 4) = 0;
  *(undefined4 *)((long)&pQVar1[2].widget + 4) = 2;
  QEvent::QEvent((QEvent *)this,type);
  (this->super_QGraphicsSceneEvent).d_ptr.d = pQVar1;
  pQVar1->q_ptr = &this->super_QGraphicsSceneEvent;
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_00813c70;
  return;
}

Assistant:

QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneContextMenuEventPrivate, type)
{
}